

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t * Gia_ManEquivReduce(Gia_Man_t *p,int fUseAll,int fDualOut,int fSkipPhase,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  void *__s;
  Gia_Rpr_t *pGVar5;
  ulong uVar6;
  int *piVar7;
  Gia_Man_t *pGVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  size_t sVar17;
  
  pGVar5 = p->pReprs;
  if (pGVar5 == (Gia_Rpr_t *)0x0) {
    if (p->pSibls != (int *)0x0) {
      sVar17 = (size_t)p->nObjs;
      __s = malloc(sVar17 * 4);
      memset(__s,0xff,sVar17 * 4);
      pGVar5 = (Gia_Rpr_t *)calloc(sVar17,4);
      p->pReprs = pGVar5;
      if (0 < (long)sVar17) {
        lVar13 = 0;
        do {
          p->pReprs[lVar13] = (Gia_Rpr_t)((uint)p->pReprs[lVar13] | 0xfffffff);
          lVar13 = lVar13 + 1;
          iVar1 = p->nObjs;
          uVar6 = (ulong)iVar1;
        } while (lVar13 < (long)uVar6);
        if (0 < iVar1) {
          piVar7 = p->pSibls;
          uVar14 = 0;
          do {
            iVar12 = piVar7[uVar14];
            lVar13 = (long)iVar12;
            if (0 < lVar13) {
              iVar16 = *(int *)((long)__s + lVar13 * 4);
              if (iVar16 == -1) {
                *(int *)((long)__s + lVar13 * 4) = iVar12;
                iVar16 = iVar12;
              }
              *(int *)((long)__s + uVar14 * 4) = iVar16;
            }
            uVar14 = uVar14 + 1;
          } while (uVar6 != uVar14);
          if (0 < iVar1) {
            lVar13 = 0;
            do {
              if (0 < p->pSibls[lVar13]) {
                uVar4 = *(uint *)((long)__s + lVar13 * 4);
                if (lVar13 <= (int)uVar4 && (long)(int)uVar4 != 0xfffffff) {
                  __assert_fail("Num == GIA_VOID || Num < Id",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
                }
                p->pReprs[lVar13] =
                     (Gia_Rpr_t)((uint)p->pReprs[lVar13] & 0xf0000000 | uVar4 & 0xfffffff);
                uVar6 = (ulong)(uint)p->nObjs;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < (int)uVar6);
          }
        }
      }
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      piVar7 = Gia_ManDeriveNexts(p);
      p->pNexts = piVar7;
      if (__s != (void *)0x0) {
        free(__s);
      }
    }
    pGVar5 = p->pReprs;
    if (pGVar5 == (Gia_Rpr_t *)0x0) {
      pcVar15 = "Gia_ManEquivReduce(): Equivalence classes are not available.\n";
      goto LAB_001fd6dc;
    }
  }
  if ((fDualOut == 0) || ((p->vCos->nSize - p->nRegs & 1U) == 0)) {
    uVar4 = p->nObjs;
    if ((int)uVar4 < 1) {
      uVar6 = 0;
LAB_001fd6f9:
      if ((uint)uVar6 != uVar4) {
        if (fSkipPhase == 0) {
          Gia_ManSetPhase(p);
        }
        if (fDualOut != 0) {
          Gia_ManEquivSetColors(p,fVerbose);
        }
        pGVar8 = Gia_ManStart(p->nObjs);
        pcVar15 = p->pName;
        if (pcVar15 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar17 = strlen(pcVar15);
          pcVar9 = (char *)malloc(sVar17 + 1);
          strcpy(pcVar9,pcVar15);
        }
        pGVar8->pName = pcVar9;
        pcVar15 = p->pSpec;
        if (pcVar15 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          sVar17 = strlen(pcVar15);
          pcVar9 = (char *)malloc(sVar17 + 1);
          strcpy(pcVar9,pcVar15);
        }
        pGVar8->pSpec = pcVar9;
        Gia_ManFillValue(p);
        p->pObjs->Value = 0;
        pVVar11 = p->vCis;
        if (0 < pVVar11->nSize) {
          lVar13 = 0;
          do {
            iVar1 = pVVar11->pArray[lVar13];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fd9d3;
            pGVar2 = p->pObjs;
            if (pGVar2 == (Gia_Obj_t *)0x0) break;
            pGVar10 = Gia_ManAppendObj(pGVar8);
            uVar6 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar6 | 0x9fffffff;
            *(ulong *)pGVar10 =
                 uVar6 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(pGVar8->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar3 = pGVar8->pObjs;
            if ((pGVar10 < pGVar3) || (pGVar3 + pGVar8->nObjs <= pGVar10)) {
LAB_001fd9f2:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(pGVar8->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555
                       );
            pGVar3 = pGVar8->pObjs;
            if ((pGVar10 < pGVar3) || (pGVar3 + pGVar8->nObjs <= pGVar10)) goto LAB_001fd9f2;
            pGVar2[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * 0x55555556;
            lVar13 = lVar13 + 1;
            pVVar11 = p->vCis;
          } while (lVar13 < pVVar11->nSize);
        }
        Gia_ManHashAlloc(pGVar8);
        pVVar11 = p->vCos;
        uVar6 = (ulong)(uint)pVVar11->nSize;
        if (0 < pVVar11->nSize) {
          lVar13 = 0;
          do {
            iVar12 = (int)uVar6;
            iVar1 = pVVar11->pArray[lVar13];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fd9d3;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar2 = p->pObjs + iVar1;
            Gia_ManEquivReduce_rec
                      (pGVar8,p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),fUseAll,
                       fDualOut);
            lVar13 = lVar13 + 1;
            pVVar11 = p->vCos;
            iVar12 = pVVar11->nSize;
            uVar6 = (ulong)iVar12;
          } while (lVar13 < (long)uVar6);
          if (0 < iVar12) {
            lVar13 = 0;
            do {
              iVar1 = pVVar11->pArray[lVar13];
              if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001fd9d3:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar2 = p->pObjs + iVar1;
              if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar4 = Gia_ManAppendCo(pGVar8,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                             pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 &
                                                            0x1fffffff)].Value);
              pGVar2->Value = uVar4;
              lVar13 = lVar13 + 1;
              pVVar11 = p->vCos;
            } while (lVar13 < pVVar11->nSize);
          }
        }
        Gia_ManHashStop(pGVar8);
        Gia_ManSetRegNum(pGVar8,p->nRegs);
        return pGVar8;
      }
    }
    else {
      uVar6 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_001fd6f9;
        if (((uint)pGVar5[uVar6] & 0xfffffff) != 0xfffffff) {
          if (((uint)pGVar5[uVar6] & 0xfffffff) < uVar4) goto LAB_001fd6f9;
          goto LAB_001fd9d3;
        }
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    pGVar8 = Gia_ManDup(p);
    return pGVar8;
  }
  pcVar15 = "Gia_ManEquivReduce(): Dual-output miter should have even number of POs.\n";
LAB_001fd6dc:
  Abc_Print(1,pcVar15);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce( Gia_Man_t * p, int fUseAll, int fDualOut, int fSkipPhase, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
    {
//        Abc_Print( 1, "Gia_ManEquivReduce(): There are no equivalences to reduce.\n" );
//        return NULL;
        return Gia_ManDup( p );
    }
/*
    if ( !Gia_ManCheckTopoOrder( p ) )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): AIG is not in a correct topological order.\n" );
        return NULL;
    }
*/
    if ( !fSkipPhase )
        Gia_ManSetPhase( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, fVerbose );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin0(pObj), fUseAll, fDualOut );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}